

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormulaTransformer.cpp
# Opt level: O0

TermList __thiscall Kernel::FormulaTransformer::apply(FormulaTransformer *this,TermList ts)

{
  uint64_t uVar1;
  bool bVar2;
  SpecialFunctor SVar3;
  Term *pTVar4;
  TermList TVar5;
  uint64_t in_RSI;
  TermList in_RDI;
  Iterator terms;
  Stack<Kernel::TermList> args;
  uint i;
  DArray<Kernel::TermList> terms_1;
  SpecialTermData *sd;
  Term *term;
  Term *in_stack_fffffffffffffe08;
  TermList in_stack_fffffffffffffe10;
  size_t in_stack_fffffffffffffe18;
  Stack<Kernel::TermList> *in_stack_fffffffffffffe20;
  Stack<Kernel::TermList> local_120 [7];
  SpecialTermData *local_28;
  uint64_t local_8;
  
  bVar2 = TermList::isVar((TermList *)in_stack_fffffffffffffe10._content);
  uVar1 = in_RSI;
  if (!bVar2) {
    pTVar4 = TermList::term((TermList *)0x85840c);
    bVar2 = Term::isSpecial((Term *)0x858421);
    if (bVar2) {
      pTVar4 = TermList::term((TermList *)0x858437);
      local_28 = Term::getSpecialData(pTVar4);
      SVar3 = Term::SpecialTermData::specialFunctor((SpecialTermData *)0x858454);
      TVar5._content = (*(code *)(&DAT_00ef5644 + *(int *)(&DAT_00ef5644 + (ulong)SVar3 * 4)))();
      return (TermList)TVar5._content;
    }
    bVar2 = Term::shared((Term *)0x858a0a);
    uVar1 = in_RSI;
    if (!bVar2) {
      Lib::Stack<Kernel::TermList>::Stack(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      Term::Iterator::Iterator
                ((Iterator *)in_stack_fffffffffffffe10._content,in_stack_fffffffffffffe08);
      while (bVar2 = Term::Iterator::hasNext((Iterator *)0x858a5c), bVar2) {
        Term::Iterator::next((Iterator *)in_stack_fffffffffffffe08);
        apply((FormulaTransformer *)pTVar4,in_RDI);
        Lib::Stack<Kernel::TermList>::push
                  ((Stack<Kernel::TermList> *)in_stack_fffffffffffffe08,in_stack_fffffffffffffe10);
      }
      Lib::Stack<Kernel::TermList>::begin(local_120);
      pTVar4 = Term::create((Term *)in_stack_fffffffffffffe10._content,
                            (TermList *)in_stack_fffffffffffffe08);
      TermList::TermList((TermList *)pTVar4,in_stack_fffffffffffffe08);
      Lib::Stack<Kernel::TermList>::~Stack((Stack<Kernel::TermList> *)pTVar4);
      uVar1 = local_8;
    }
  }
  local_8 = uVar1;
  return (TermList)local_8;
}

Assistant:

TermList FormulaTransformer::apply(TermList ts) {
  if (ts.isVar()) {
    return ts;
  }

  Term* term = ts.term();

  if (term->isSpecial()) {
    Term::SpecialTermData *sd = ts.term()->getSpecialData();
    switch (sd->specialFunctor()) {
      case SpecialFunctor::ITE:
        return TermList(Term::createITE(apply(sd->getCondition()),
                                        apply(*term->nthArgument(0)),
                                        apply(*term->nthArgument(1)),
                                        sd->getSort()));

      case SpecialFunctor::FORMULA:
        return TermList(Term::createFormula(apply(sd->getFormula())));

      case SpecialFunctor::LET:
        return TermList(Term::createLet(sd->getFunctor(),
                                        sd->getVariables(),
                                        apply(sd->getBinding()),
                                        apply(*term->nthArgument(0)),
                                        sd->getSort()));

      case SpecialFunctor::LET_TUPLE:
        return TermList(Term::createTupleLet(sd->getFunctor(),
                                             sd->getTupleSymbols(),
                                             apply(sd->getBinding()),
                                             apply(*term->nthArgument(0)),
                                             sd->getSort()));

      case SpecialFunctor::TUPLE:
        return TermList(Term::createTuple(apply(TermList(sd->getTupleTerm())).term()));

      case SpecialFunctor::LAMBDA:
        NOT_IMPLEMENTED;
      case SpecialFunctor::MATCH: {
        DArray<TermList> terms(term->arity());
        for (unsigned i = 0; i < term->arity(); i++) {
          terms[i] = apply(*term->nthArgument(i));
        }
        return TermList(Term::createMatch(sd->getSort(), sd->getMatchedSort(), term->arity(), terms.begin()));
      }

    }
    ASSERTION_VIOLATION_REP(ts.toString());
  }

  if (term->shared()) {
    return ts;
  }

  Stack<TermList> args;
  Term::Iterator terms(term);
  while (terms.hasNext()) {
    args.push(apply(terms.next()));
  }

  return TermList(Term::create(term, args.begin()));
}